

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

void If_ManComputeSwitching(If_Man_t *pIfMan)

{
  int iVar1;
  int c;
  int iVar2;
  abctime aVar3;
  Gia_Man_t *p;
  Vec_Int_t *pVVar4;
  If_Obj_t *pIVar5;
  If_Obj_t *pIVar6;
  abctime aVar7;
  int iLit0_1;
  int iLit1;
  int iLit0;
  int i;
  If_Obj_t *pIfObj;
  Vec_Int_t *vCopy;
  Gia_Man_t *pNew;
  abctime clk;
  If_Man_t *pIfMan_local;
  
  aVar3 = Abc_Clock();
  if (pIfMan->vSwitching != (Vec_Int_t *)0x0) {
    __assert_fail("pIfMan->vSwitching == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                  ,0x42,"void If_ManComputeSwitching(If_Man_t *)");
  }
  iVar1 = If_ManObjNum(pIfMan);
  p = Gia_ManStart(iVar1);
  iVar1 = If_ManObjNum(pIfMan);
  pVVar4 = Vec_IntAlloc(iVar1);
  Vec_IntPush(pVVar4,1);
  for (iLit1 = 0; iVar1 = Vec_PtrSize(pIfMan->vCis), iLit1 < iVar1; iLit1 = iLit1 + 1) {
    Vec_PtrEntry(pIfMan->vCis,iLit1);
    iVar1 = Gia_ManAppendCi(p);
    Vec_IntPush(pVVar4,iVar1);
  }
  for (iLit1 = 0; iVar1 = Vec_PtrSize(pIfMan->vObjs), iLit1 < iVar1; iLit1 = iLit1 + 1) {
    pIVar5 = (If_Obj_t *)Vec_PtrEntry(pIfMan->vObjs,iLit1);
    if (((undefined1  [112])*pIVar5 & (undefined1  [112])0xf) == (undefined1  [112])0x4) {
      pIVar6 = If_ObjFanin0(pIVar5);
      iVar1 = Vec_IntEntry(pVVar4,pIVar6->Id);
      iVar2 = If_ObjFaninC0(pIVar5);
      iVar1 = Abc_LitNotCond(iVar1,iVar2);
      pIVar6 = If_ObjFanin1(pIVar5);
      iVar2 = Vec_IntEntry(pVVar4,pIVar6->Id);
      c = If_ObjFaninC1(pIVar5);
      iVar2 = Abc_LitNotCond(iVar2,c);
      iVar1 = Gia_ManAppendAnd(p,iVar1,iVar2);
      Vec_IntPush(pVVar4,iVar1);
    }
  }
  for (iLit1 = 0; iVar1 = Vec_PtrSize(pIfMan->vCos), iLit1 < iVar1; iLit1 = iLit1 + 1) {
    pIVar5 = (If_Obj_t *)Vec_PtrEntry(pIfMan->vCos,iLit1);
    pIVar6 = If_ObjFanin0(pIVar5);
    iVar1 = Vec_IntEntry(pVVar4,pIVar6->Id);
    iVar2 = If_ObjFaninC0(pIVar5);
    iVar1 = Abc_LitNotCond(iVar1,iVar2);
    iVar1 = Gia_ManAppendCo(p,iVar1);
    Vec_IntPush(pVVar4,iVar1);
  }
  iVar1 = Vec_IntSize(pVVar4);
  iVar2 = If_ManObjNum(pIfMan);
  if (iVar1 == iVar2) {
    Vec_IntFree(pVVar4);
    pVVar4 = Gia_ManComputeSwitchProbs(p,0x30,0x10,0);
    pIfMan->vSwitching = pVVar4;
    Gia_ManStop(p);
    if (pIfMan->pPars->fVerbose != 0) {
      aVar7 = Abc_Clock();
      Abc_PrintTime(1,"Computing switching activity",aVar7 - aVar3);
    }
    return;
  }
  __assert_fail("Vec_IntSize(vCopy) == If_ManObjNum(pIfMan)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                ,0x57,"void If_ManComputeSwitching(If_Man_t *)");
}

Assistant:

void If_ManComputeSwitching( If_Man_t * pIfMan )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vCopy;
    If_Obj_t * pIfObj;
    int i;
    assert( pIfMan->vSwitching == NULL );
    // create the new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    vCopy = Vec_IntAlloc( If_ManObjNum(pIfMan) );
    // constant and inputs
    Vec_IntPush( vCopy, 1 );
    If_ManForEachCi( pIfMan, pIfObj, i )
        Vec_IntPush( vCopy, Gia_ManAppendCi(pNew) );
    // internal nodes
    If_ManForEachNode( pIfMan, pIfObj, i )
    {
        int iLit0 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin0(pIfObj)->Id), If_ObjFaninC0(pIfObj) );
        int iLit1 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin1(pIfObj)->Id), If_ObjFaninC1(pIfObj) );
        Vec_IntPush( vCopy, Gia_ManAppendAnd(pNew, iLit0, iLit1) );
    }
    // outputs
    If_ManForEachCo( pIfMan, pIfObj, i )
    {
        int iLit0 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin0(pIfObj)->Id), If_ObjFaninC0(pIfObj) );
        Vec_IntPush( vCopy, Gia_ManAppendCo(pNew, iLit0) );
    }
    assert( Vec_IntSize(vCopy) == If_ManObjNum(pIfMan) );
    Vec_IntFree( vCopy );
    // compute switching activity
    pIfMan->vSwitching = Gia_ManComputeSwitchProbs( pNew, 48, 16, 0 );
    Gia_ManStop( pNew );
    if ( pIfMan->pPars->fVerbose )
        Abc_PrintTime( 1, "Computing switching activity", Abc_Clock() - clk );
}